

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage_converter.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Alloc_hider cvt;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> _Var3;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> _Var4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  runtime_error *prVar10;
  pointer __old_p;
  pointer __old_p_1;
  char buf [32];
  string local_68;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> local_48;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> local_40;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test UTF-8",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- From UTF-8",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  booster::locale::util::create_utf8_converter();
  cvt._M_p = local_68._M_dataplus._M_p;
  test_counter = test_counter + 1;
  if ((base_converter *)local_68._M_dataplus._M_p == (base_converter *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt.get()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  cVar5 = (**(code **)(*(long *)local_68._M_dataplus._M_p + 0x18))(local_68._M_dataplus._M_p);
  if (cVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt->is_thread_safe()",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)local_68._M_dataplus._M_p + 0x10))(local_68._M_dataplus._M_p);
  if (iVar7 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt->max_len() == 4",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Correct",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_40b2 + 3;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_40b2 + 4);
  if (iVar7 != 0x7f) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x81);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_to(*cvt,\"\\x7f\",0x7f)",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3ea6;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3ea6 + 2);
  if (iVar7 != 0x80) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x82);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xC2\\x80\",0x80)",0x1e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3eba;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3eba + 2);
  if (iVar7 != 0x7ff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x83);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xdf\\xBF\",0x7FF)",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3ece;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3ece + 3);
  if (iVar7 != 0x800) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x84);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xe0\\xa0\\x80\",0x800)",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3efa;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3efa + 3);
  if (iVar7 != 0xffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x85);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xef\\xbf\\xbf\",0xFFFF)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3f1a;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3f1a + 4);
  if (iVar7 != 0x10000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x86);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\\x90\\x80\\x80\",0x10000)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3f46;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3f46 + 4);
  if (iVar7 != 0x10ffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x87);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x8f\\xbf\\xbf\",0x10FFFF)",0x2a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Too big",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3f70;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3f70 + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x9f\\x80\\x80\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3f84;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3f84 + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xfb\\xbf\\xbf\\xbf\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3f98;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3f98 + 5);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf8\\x90\\x80\\x80\\x80\",illegal)",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3fc4;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3fc4 + 6);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xfd\\xbf\\xbf\\xbf\\xbf\\xbf\",illegal)",0x31);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Invalid trail",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4006;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4006 + 2);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xC2\\x7F\",illegal)",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_401a;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_401a + 2);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x91);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xdf\\x7F\",illegal)",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_402e;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_402e + 3);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x92);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xe0\\x7F\\x80\",illegal)",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_404e;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_404e + 3);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x93);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xef\\xbf\\x7F\",illegal)",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_402e;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_402e + 3);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x94);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xe0\\x7F\\x80\",illegal)",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_404e;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_404e + 3);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x95);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xef\\xbf\\x7F\",illegal)",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4062;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4062 + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x96);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\\x7F\\x80\\x80\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4076;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4076 + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x97);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x7f\\xbf\\xbf\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_408a;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_408a + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x98);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\\x90\\x7F\\x80\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_409e;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_409e + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x99);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x8f\\x7F\\xbf\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_40b2;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_40b2 + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\\x90\\x80\\x7F\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_40c6;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_40c6 + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x8f\\xbf\\x7F\",illegal)",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Invalid length",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  make2::buf[0] = 0xc2;
  make2::buf[1] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make2::buf;
  sVar9 = strlen((char *)make2::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make2::buf + sVar9);
  if (iVar7 != 0x80) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make2(0x80),0x80)",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make2::buf[0] = 0xdf;
  make2::buf[1] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make2::buf;
  sVar9 = strlen((char *)make2::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make2::buf + sVar9);
  if (iVar7 != 0x7ff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make2(0x7ff),0x7ff)",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0xa0;
  make3::buf[2] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != 0x800) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0x800),0x800)",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xef;
  make3::buf[1] = 0xbf;
  make3::buf[2] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != 0xffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0xffff),0xffff)",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"𐀀",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != 0x10000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x10000),0x10000)",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\x0010ffff",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != 0x10ffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x10ffff),0x10ffff)",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf4;
  make4::buf[1] = 0x90;
  make4::buf[2] = 0x80;
  make4::buf[3] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x110000),illegal)",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf7;
  make4::buf[1] = 0xbf;
  make4::buf[2] = 0xbf;
  make4::buf[3] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xaa);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x1fffff),illegal)",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make2::buf[0] = 0xc0;
  make2::buf[1] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make2::buf;
  sVar9 = strlen((char *)make2::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make2::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xac);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make2(0),illegal)",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x80;
  make3::buf[2] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xad);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0),illegal)",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xae);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0),illegal)",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make2::buf[0] = 0xc1;
  make2::buf[1] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make2::buf;
  sVar9 = strlen((char *)make2::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make2::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xaf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make2(0x7f),illegal)",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x81;
  make3::buf[2] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0x7f),illegal)",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\x7f",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x7f),illegal)",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x82;
  make3::buf[2] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0x80),illegal)",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\x80",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x80),illegal)",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x9f;
  make3::buf[2] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0x7ff),illegal)",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"߿",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x7ff),illegal)",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"耀",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0x8000),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\xffff",4);
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0xffff),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- Invalid surrogate",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xa0;
  make3::buf[2] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0xD800),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xaf;
  make3::buf[2] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0xDBFF),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xb0;
  make3::buf[2] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0xDC00),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xbf;
  make3::buf[2] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make3::buf;
  sVar9 = strlen((char *)make3::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make3::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make3(0xDFFF),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xa0;
  make4::buf[3] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0xD800),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xaf;
  make4::buf[3] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0xDBFF),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xb0;
  make4::buf[3] = 0x80;
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0xDC00),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xbf;
  make4::buf[3] = 0xbf;
  local_68._M_dataplus._M_p = (pointer)make4::buf;
  sVar9 = strlen((char *)make4::buf);
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,make4::buf + sVar9);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,make4(0xDFFF),illegal)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Incomplete",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_408a + 3;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_408a + 4);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\x80\",illegal)",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4254;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4254 + 1);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xca);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xC2\",incomplete)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4268;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4268 + 1);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xdf\",incomplete)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_427c;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_427c + 1);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xce);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xe0\",incomplete)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4290;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4290 + 2);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xe0\\xa0\",incomplete)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_42a4;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_42a4 + 2);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xef\\xbf\",incomplete)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_42b8;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_42b8 + 1);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xef\",incomplete)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_42ce;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_42ce + 3);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\\x90\\x80\",incomplete)",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_42e4;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_42e4 + 2);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\\x90\",incomplete)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_3de8 + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_3de8 + 2);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf0\",incomplete)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4310;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4310 + 3);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x8f\\xbf\",incomplete)",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4326;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_4326 + 2);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\\x8f\",incomplete)",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_433c;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x28))(cvt._M_p,&local_68,anon_var_dwarf_433c + 1);
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xda);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xf4\",incomplete)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- To UTF-8",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Test correct",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0x7f,anon_var_dwarf_40b2 + 3);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x7f,\"\\x7f\")",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0x80,anon_var_dwarf_3ea6);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x80,\"\\xC2\\x80\")",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0x7ff,anon_var_dwarf_3eba);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x7FF,\"\\xdf\\xBF\")",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))
                    (cvt._M_p,0x7ff,&local_68,(undefined1 *)((long)&local_68._M_dataplus._M_p + 1));
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_incomplete(*cvt,0x7FF,1)",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0x800,anon_var_dwarf_3ece);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x800,\"\\xe0\\xa0\\x80\")",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))
                    (cvt._M_p,0x800,&local_68,(undefined1 *)((long)&local_68._M_dataplus._M_p + 2));
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_incomplete(*cvt,0x800,2)",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))
                    (cvt._M_p,0x800,&local_68,(undefined1 *)((long)&local_68._M_dataplus._M_p + 1));
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_incomplete(*cvt,0x800,1)",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0xffff,anon_var_dwarf_3efa);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0xFFFF,\"\\xef\\xbf\\xbf\")",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))
                    (cvt._M_p,0x10000,&local_68,(undefined1 *)((long)&local_68._M_dataplus._M_p + 3)
                    );
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_incomplete(*cvt,0x10000,3)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))
                    (cvt._M_p,0x10000,&local_68,(undefined1 *)((long)&local_68._M_dataplus._M_p + 2)
                    );
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_incomplete(*cvt,0x10000,2)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))
                    (cvt._M_p,0x10000,&local_68,(undefined1 *)((long)&local_68._M_dataplus._M_p + 1)
                    );
  if (iVar7 != -2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_incomplete(*cvt,0x10000,1)",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0x10000,anon_var_dwarf_3f1a);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xeb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x10000,\"\\xf0\\x90\\x80\\x80\")",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from((base_converter *)cvt._M_p,0x10ffff,anon_var_dwarf_3f46);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xec);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x10FFFF,\"\\xf4\\x8f\\xbf\\xbf\")",0x2c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- Test no surrogate ",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))(cvt._M_p,0xd800,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0xD800,0)",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))(cvt._M_p,0xdbff,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0xDBFF,0)",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))(cvt._M_p,0xdc00,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0xDC00,0)",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))(cvt._M_p,0xdfff,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0xDFFF,0)",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Test invalid ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))(cvt._M_p,0x110000,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0x110000,0)",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)cvt._M_p + 0x30))(cvt._M_p,0x1fffff,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0x1FFFFF,0)",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test windows-1255",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"windows-1255","");
  booster::locale::util::create_simple_converter((string *)&local_48);
  _Var3._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (base_converter *)0x0;
  if ((base_converter *)cvt._M_p != (base_converter *)0x0) {
    (**(code **)(*(long *)cvt._M_p + 8))(cvt._M_p);
  }
  if (local_48._M_head_impl != (base_converter *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  local_48._M_head_impl = (base_converter *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  if (_Var3._M_head_impl == (base_converter *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt.get()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  cVar5 = (**(code **)(*(long *)_Var3._M_head_impl + 0x18))(_Var3._M_head_impl);
  if (cVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt->is_thread_safe()",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x10))(_Var3._M_head_impl);
  if (iVar7 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x101);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt->max_len() == 1",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- From 1255",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_44d1;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_44d1 + 1);
  if (iVar7 != 0x20aa) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xa4\",0x20aa)",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_427c;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_427c + 1);
  if (iVar7 != 0x5d0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x106);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xe0\",0x05d0)",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_44f5;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_44f5 + 1);
  if (iVar7 != 0x5b4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x107);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_to(*cvt,\"\\xc4\",0x5b4)",0x1b)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_450d;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_450d + 1);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x108);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xfb\",illegal)",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4525;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_4525 + 1);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x109);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xdd\",illegal)",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_453d;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_453d + 1);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xff\",illegal)",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_68._M_dataplus._M_p = anon_var_dwarf_4555;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x28))
                    (_Var3._M_head_impl,&local_68,anon_var_dwarf_4555 + 1);
  if (iVar7 != 0x200f) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_to(*cvt,\"\\xfe\",0x200f)",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- To 1255",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  test_counter = test_counter + 1;
  bVar6 = test_from(_Var3._M_head_impl,0x20aa,anon_var_dwarf_44d1);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x20aa,\"\\xa4\")",0x1e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from(_Var3._M_head_impl,0x5d0,anon_var_dwarf_427c);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x05d0,\"\\xe0\")",0x1e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from(_Var3._M_head_impl,0x5b4,anon_var_dwarf_44f5);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x5b4,\"\\xc4\")",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar6 = test_from(_Var3._M_head_impl,0x200f,anon_var_dwarf_4555);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x112);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," test_from(*cvt,0x200f,\"\\xfe\")",0x1e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x30))
                    (_Var3._M_head_impl,0xe4,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x114);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0xe4,0)",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar7 = (**(code **)(*(long *)_Var3._M_head_impl + 0x30))
                    (_Var3._M_head_impl,0xd0,&local_68,&local_48);
  if (iVar7 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x115);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," test_from(*cvt,0xd0,0)",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing Shift-JIS using ICU/uconv",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Shift-JIS","");
  booster::locale::impl_icu::create_uconv_converter((string *)&local_48);
  _Var4._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (base_converter *)0x0;
  if (_Var3._M_head_impl != (base_converter *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))(_Var3._M_head_impl);
  }
  if (local_48._M_head_impl != (base_converter *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  local_48._M_head_impl = (base_converter *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  if (_Var4._M_head_impl == (base_converter *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," cvt.get()",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar7 = error_counter + 1;
    bVar6 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar6) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar10,&local_68);
      __cxa_throw(prVar10,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  local_38._M_head_impl = _Var4._M_head_impl;
  test_shiftjis((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                 *)&local_38);
  if (local_38._M_head_impl != (base_converter *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  local_38._M_head_impl = (base_converter *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing Shift-JIS using POSIX/iconv",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Shift-JIS","");
  booster::locale::impl_posix::create_iconv_converter((string *)&local_48);
  _Var3._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (base_converter *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (_Var3._M_head_impl == (base_converter *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"- Shift-JIS is not supported!",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  else {
    local_40._M_head_impl = _Var3._M_head_impl;
    test_shiftjis((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                   *)&local_40);
    if (local_40._M_head_impl != (base_converter *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
    local_40._M_head_impl = (base_converter *)0x0;
  }
  iVar7 = test_counter - error_counter;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," tests",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (0 < error_counter) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed ",7);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,error_counter);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," tests",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  lVar2 = std::cout;
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::runtime_error::what + *(long *)(lVar2 + -0x18)) = 1;
  *(undefined8 *)(std::locale::~locale + *(long *)(lVar2 + -0x18)) = 5;
  poVar8 = std::ostream::_M_insert<double>(((double)iVar7 * 100.0) / (double)test_counter);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"% of tests completed sucsessefully",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        using namespace booster::locale::util;

        std::unique_ptr<base_converter> cvt;

        std::cout << "Test UTF-8" << std::endl;
        std::cout << "- From UTF-8" << std::endl;


        cvt = create_utf8_converter();
        TEST(cvt.get());
        TEST(cvt->is_thread_safe());
        TEST(cvt->max_len() == 4);

        std::cout << "-- Correct" << std::endl;

        TEST_TO("\x7f",0x7f);
        TEST_TO("\xC2\x80",0x80);
        TEST_TO("\xdf\xBF",0x7FF);
        TEST_TO("\xe0\xa0\x80",0x800);
        TEST_TO("\xef\xbf\xbf",0xFFFF);
        TEST_TO("\xf0\x90\x80\x80",0x10000);
        TEST_TO("\xf4\x8f\xbf\xbf",0x10FFFF);

        std::cout << "-- Too big" << std::endl;
        TEST_TO("\xf4\x9f\x80\x80",illegal); //  11 0000
        TEST_TO("\xfb\xbf\xbf\xbf",illegal); // 3FF FFFF
        TEST_TO("\xf8\x90\x80\x80\x80",illegal);  // 400 0000
        TEST_TO("\xfd\xbf\xbf\xbf\xbf\xbf",illegal);  // 7fff ffff

        std::cout << "-- Invalid trail" << std::endl;
        TEST_TO("\xC2\x7F",illegal);
        TEST_TO("\xdf\x7F",illegal);
        TEST_TO("\xe0\x7F\x80",illegal);
        TEST_TO("\xef\xbf\x7F",illegal);
        TEST_TO("\xe0\x7F\x80",illegal);
        TEST_TO("\xef\xbf\x7F",illegal);
        TEST_TO("\xf0\x7F\x80\x80",illegal);
        TEST_TO("\xf4\x7f\xbf\xbf",illegal);
        TEST_TO("\xf0\x90\x7F\x80",illegal);
        TEST_TO("\xf4\x8f\x7F\xbf",illegal);
        TEST_TO("\xf0\x90\x80\x7F",illegal);
        TEST_TO("\xf4\x8f\xbf\x7F",illegal);

        std::cout << "-- Invalid length" << std::endl;

        /// Test that this actually works
        TEST_TO(make2(0x80),0x80);
        TEST_TO(make2(0x7ff),0x7ff);

        TEST_TO(make3(0x800),0x800);
        TEST_TO(make3(0xffff),0xffff);

        TEST_TO(make4(0x10000),0x10000);
        TEST_TO(make4(0x10ffff),0x10ffff);

        TEST_TO(make4(0x110000),illegal);
        TEST_TO(make4(0x1fffff),illegal);
        
        TEST_TO(make2(0),illegal);
        TEST_TO(make3(0),illegal);
        TEST_TO(make4(0),illegal);
        TEST_TO(make2(0x7f),illegal);
        TEST_TO(make3(0x7f),illegal);
        TEST_TO(make4(0x7f),illegal);

        TEST_TO(make3(0x80),illegal);
        TEST_TO(make4(0x80),illegal);
        TEST_TO(make3(0x7ff),illegal);
        TEST_TO(make4(0x7ff),illegal);

        TEST_TO(make4(0x8000),illegal);
        TEST_TO(make4(0xffff),illegal);
        
        std::cout << "-- Invalid surrogate" << std::endl;
        
        TEST_TO(make3(0xD800),illegal);
        TEST_TO(make3(0xDBFF),illegal);
        TEST_TO(make3(0xDC00),illegal);
        TEST_TO(make3(0xDFFF),illegal);

        TEST_TO(make4(0xD800),illegal);
        TEST_TO(make4(0xDBFF),illegal);
        TEST_TO(make4(0xDC00),illegal);
        TEST_TO(make4(0xDFFF),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        TEST_TO("\x80",illegal);
        TEST_TO("\xC2",incomplete);
        
        TEST_TO("\xdf",incomplete);

        TEST_TO("\xe0",incomplete);
        TEST_TO("\xe0\xa0",incomplete);

        TEST_TO("\xef\xbf",incomplete);
        TEST_TO("\xef",incomplete);

        TEST_TO("\xf0\x90\x80",incomplete);
        TEST_TO("\xf0\x90",incomplete);
        TEST_TO("\xf0",incomplete);

        TEST_TO("\xf4\x8f\xbf",incomplete);
        TEST_TO("\xf4\x8f",incomplete);
        TEST_TO("\xf4",incomplete);

        std::cout << "- To UTF-8" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        TEST_FROM("\x7f",0x7f);
        TEST_FROM("\xC2\x80",0x80);
        TEST_FROM("\xdf\xBF",0x7FF);
        TEST_INC(0x7FF,1);
        TEST_FROM("\xe0\xa0\x80",0x800);
        TEST_INC(0x800,2);
        TEST_INC(0x800,1);
        TEST_FROM("\xef\xbf\xbf",0xFFFF);
        TEST_INC(0x10000,3);
        TEST_INC(0x10000,2);
        TEST_INC(0x10000,1);
        TEST_FROM("\xf0\x90\x80\x80",0x10000);
        TEST_FROM("\xf4\x8f\xbf\xbf",0x10FFFF);
       
        std::cout << "-- Test no surrogate " << std::endl;
         
        TEST_FROM(0,0xD800);
        TEST_FROM(0,0xDBFF);
        TEST_FROM(0,0xDC00);
        TEST_FROM(0,0xDFFF);
        
        std::cout << "-- Test invalid " << std::endl;
        
        TEST_FROM(0,0x110000);
        TEST_FROM(0,0x1FFFFF);


        std::cout << "Test windows-1255" << std::endl;

        cvt = create_simple_converter("windows-1255");

        TEST(cvt.get());
        TEST(cvt->is_thread_safe());
        TEST(cvt->max_len() == 1);

        std::cout << "- From 1255" << std::endl;

        TEST_TO("\xa4",0x20aa);
        TEST_TO("\xe0",0x05d0);
        TEST_TO("\xc4",0x5b4);
        TEST_TO("\xfb",illegal);
        TEST_TO("\xdd",illegal);
        TEST_TO("\xff",illegal);
        TEST_TO("\xfe",0x200f);

        std::cout << "- To 1255" << std::endl;

        TEST_FROM("\xa4",0x20aa);
        TEST_FROM("\xe0",0x05d0);
        TEST_FROM("\xc4",0x5b4);
        TEST_FROM("\xfe",0x200f);

        TEST_FROM(0,0xe4);
        TEST_FROM(0,0xd0);

        #ifdef BOOSTER_LOCALE_WITH_ICU
        std::cout << "Testing Shift-JIS using ICU/uconv" << std::endl;

        cvt = booster::locale::impl_icu::create_uconv_converter("Shift-JIS");
        TEST(cvt.get());
        test_shiftjis(std::move(cvt));
        #endif

        #if defined(BOOSTER_LOCALE_WITH_ICONV) && !defined(BOOSTER_LOCALE_NO_POSIX_BACKEND)
        std::cout << "Testing Shift-JIS using POSIX/iconv" << std::endl;

        cvt = booster::locale::impl_posix::create_iconv_converter("Shift-JIS");
        if(cvt.get()) {
            test_shiftjis(std::move(cvt));
        }
        else {
            std::cout<< "- Shift-JIS is not supported!" << std::endl;
        }
        #endif

    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}